

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaqgs.c
# Opt level: O0

void slaqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  void *pvVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float cj;
  float small;
  float large;
  int irow;
  int_t j;
  int_t i;
  float *Aval;
  NCformat *Astore;
  char *equed_local;
  float amax_local;
  float colcnd_local;
  float rowcnd_local;
  float *c_local;
  float *r_local;
  SuperMatrix *A_local;
  
  if ((A->nrow < 1) || (A->ncol < 1)) {
    *equed = 'N';
  }
  else {
    pvVar1 = A->Store;
    lVar2 = *(long *)((long)pvVar1 + 8);
    fVar3 = smach("Safe minimum");
    fVar4 = smach("Precision");
    if (((rowcnd < 0.1) || (amax < fVar3 / fVar4)) || (1.0 / (fVar3 / fVar4) < amax)) {
      if (colcnd < 0.1) {
        for (large = 0.0; (int)large < A->ncol; large = (float)((int)large + 1)) {
          fVar3 = c[(int)large];
          for (irow = *(int *)(*(long *)((long)pvVar1 + 0x18) + (long)(int)large * 4);
              irow < *(int *)(*(long *)((long)pvVar1 + 0x18) + (long)((int)large + 1) * 4);
              irow = irow + 1) {
            *(float *)(lVar2 + (long)irow * 4) =
                 fVar3 * r[*(int *)(*(long *)((long)pvVar1 + 0x10) + (long)irow * 4)] *
                 *(float *)(lVar2 + (long)irow * 4);
          }
        }
        *equed = 'B';
      }
      else {
        for (large = 0.0; (int)large < A->ncol; large = (float)((int)large + 1)) {
          for (irow = *(int *)(*(long *)((long)pvVar1 + 0x18) + (long)(int)large * 4);
              irow < *(int *)(*(long *)((long)pvVar1 + 0x18) + (long)((int)large + 1) * 4);
              irow = irow + 1) {
            *(float *)(lVar2 + (long)irow * 4) =
                 r[*(int *)(*(long *)((long)pvVar1 + 0x10) + (long)irow * 4)] *
                 *(float *)(lVar2 + (long)irow * 4);
          }
        }
        *equed = 'R';
      }
    }
    else if (colcnd < 0.1) {
      for (large = 0.0; (int)large < A->ncol; large = (float)((int)large + 1)) {
        fVar3 = c[(int)large];
        for (irow = *(int *)(*(long *)((long)pvVar1 + 0x18) + (long)(int)large * 4);
            irow < *(int *)(*(long *)((long)pvVar1 + 0x18) + (long)((int)large + 1) * 4);
            irow = irow + 1) {
          *(float *)(lVar2 + (long)irow * 4) = fVar3 * *(float *)(lVar2 + (long)irow * 4);
        }
      }
      *equed = 'C';
    }
    else {
      *equed = 'N';
    }
  }
  return;
}

Assistant:

void
slaqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    Aval[i] *= cj;
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= r[irow];
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= cj * r[irow];
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}